

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Checkpoint(sqlite3 *db,int iDb,int eMode,int *pnLog,int *pnCkpt)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  int bBusy;
  int i;
  int rc;
  int local_34;
  int iVar2;
  
  local_34 = 0;
  bVar1 = false;
  for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x28) && local_34 == 0; iVar2 = iVar2 + 1) {
    if ((iVar2 == in_ESI) || (in_ESI == 0xc)) {
      local_34 = sqlite3BtreeCheckpoint
                           ((Btree *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),in_R8,
                            (int *)CONCAT44(local_34,iVar2));
      in_RCX = 0;
      in_R8 = (int *)0x0;
      if (local_34 == 5) {
        bVar1 = true;
        local_34 = 0;
      }
    }
  }
  if ((local_34 == 0) && (bVar1)) {
    local_34 = 5;
  }
  return local_34;
}

Assistant:

SQLITE_PRIVATE int sqlite3Checkpoint(sqlite3 *db, int iDb, int eMode, int *pnLog, int *pnCkpt){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Used to iterate through attached dbs */
  int bBusy = 0;                  /* True if SQLITE_BUSY has been encountered */

  assert( sqlite3_mutex_held(db->mutex) );
  assert( !pnLog || *pnLog==-1 );
  assert( !pnCkpt || *pnCkpt==-1 );
  testcase( iDb==SQLITE_MAX_ATTACHED ); /* See forum post a006d86f72 */
  testcase( iDb==SQLITE_MAX_DB );

  for(i=0; i<db->nDb && rc==SQLITE_OK; i++){
    if( i==iDb || iDb==SQLITE_MAX_DB ){
      rc = sqlite3BtreeCheckpoint(db->aDb[i].pBt, eMode, pnLog, pnCkpt);
      pnLog = 0;
      pnCkpt = 0;
      if( rc==SQLITE_BUSY ){
        bBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }

  return (rc==SQLITE_OK && bBusy) ? SQLITE_BUSY : rc;
}